

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderWindowOuterBorders(ImGuiWindow *window)

{
  float thickness;
  ImDrawList *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImGuiContext *pIVar8;
  ImU32 IVar9;
  int border_n;
  float fVar10;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar11;
  float fVar12;
  float fVar13;
  ImRect IVar14;
  ImVec4 local_98;
  ImVec2 local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  ImVec2 local_30;
  
  pIVar8 = GImGui;
  fVar10 = window->WindowRounding;
  thickness = window->WindowBorderSize;
  if ((0.0 < thickness) && ((window->Flags & 0x80) == 0)) {
    pIVar1 = window->DrawList;
    local_80.y = (window->Pos).y + (window->Size).y;
    local_80.x = (window->Pos).x + (window->Size).x;
    local_98.x = (GImGui->Style).Colors[5].x;
    local_98.y = (GImGui->Style).Colors[5].y;
    uVar2 = (GImGui->Style).Colors[5].z;
    uVar3 = (GImGui->Style).Colors[5].w;
    local_98.w = (GImGui->Style).Alpha * (float)uVar3;
    local_98.z = (float)uVar2;
    IVar9 = ColorConvertFloat4ToU32(&local_98);
    ImDrawList::AddRect(pIVar1,&window->Pos,&local_80,IVar9,fVar10,0,thickness);
  }
  border_n = (int)window->ResizeBorderHeld;
  if (border_n != -1) {
    fVar11 = 0.0;
    fVar12 = 0.0;
    IVar14 = GetResizeBorderRect(window,border_n,fVar10,0.0);
    local_68 = IVar14.Min.y;
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_4_ = IVar14.Min.x;
    local_48._4_4_ = IVar14.Min.y;
    local_48._12_4_ = extraout_XMM0_Dd;
    local_58 = IVar14.Max.x - IVar14.Min.x;
    local_78 = IVar14.Max.y - local_68;
    fStack_50 = fVar11 - extraout_XMM0_Dc;
    fStack_4c = fVar12 - extraout_XMM0_Dd;
    fVar12 = resize_border_def[border_n].InnerDir.x * fVar10;
    fVar13 = resize_border_def[border_n].InnerDir.y * fVar10;
    local_98.y = resize_border_def[border_n].SegmentN1.y * local_78 + local_68 + 0.5 + fVar13;
    local_98.x = resize_border_def[border_n].SegmentN1.x * local_58 + IVar14.Min.x + 0.5 + fVar12;
    fVar11 = resize_border_def[border_n].OuterAngle;
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    fStack_64 = local_68;
    fStack_60 = local_68;
    fStack_5c = local_68;
    fStack_54 = local_78;
    ImDrawList::PathArcTo(window->DrawList,(ImVec2 *)&local_98,fVar10,fVar11 + -0.7853982,fVar11,0);
    local_98.y = local_78 * resize_border_def[border_n].SegmentN2.y + local_68 + 0.5 + fVar13;
    local_98.x = resize_border_def[border_n].SegmentN2.x * local_58 + (float)local_48._0_4_ + 0.5 +
                 fVar12;
    ImDrawList::PathArcTo(window->DrawList,(ImVec2 *)&local_98,fVar10,fVar11,fVar11 + 0.7853982,0);
    pIVar1 = window->DrawList;
    local_98.x = (GImGui->Style).Colors[0x1d].x;
    local_98.y = (GImGui->Style).Colors[0x1d].y;
    uVar4 = (GImGui->Style).Colors[0x1d].z;
    uVar5 = (GImGui->Style).Colors[0x1d].w;
    local_98.w = (GImGui->Style).Alpha * (float)uVar5;
    local_98.z = (float)uVar4;
    IVar9 = ColorConvertFloat4ToU32(&local_98);
    fVar10 = 2.0;
    if (2.0 <= thickness) {
      fVar10 = thickness;
    }
    ImDrawList::AddPolyline(pIVar1,(pIVar1->_Path).Data,(pIVar1->_Path).Size,IVar9,0,fVar10);
    (pIVar1->_Path).Size = 0;
  }
  if (((0.0 < (pIVar8->Style).FrameBorderSize) && ((window->Flags & 1) == 0)) &&
     ((window->field_0x3e1 & 1) == 0)) {
    fVar10 = (window->Pos).y;
    fVar11 = ImGuiWindow::TitleBarHeight(window);
    local_30.y = fVar11 + fVar10 + -1.0;
    pIVar1 = window->DrawList;
    fVar10 = (window->Pos).x;
    local_80.y = local_30.y;
    local_80.x = thickness + fVar10;
    local_30.x = (fVar10 + (window->Size).x) - thickness;
    local_98.x = (GImGui->Style).Colors[5].x;
    local_98.y = (GImGui->Style).Colors[5].y;
    uVar6 = (GImGui->Style).Colors[5].z;
    uVar7 = (GImGui->Style).Colors[5].w;
    local_98.w = (GImGui->Style).Alpha * (float)uVar7;
    local_98.z = (float)uVar6;
    IVar9 = ColorConvertFloat4ToU32(&local_98);
    ImDrawList::AddLine(pIVar1,&local_80,&local_30,IVar9,(pIVar8->Style).FrameBorderSize);
  }
  return;
}

Assistant:

static void ImGui::RenderWindowOuterBorders(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    float rounding = window->WindowRounding;
    float border_size = window->WindowBorderSize;
    if (border_size > 0.0f && !(window->Flags & ImGuiWindowFlags_NoBackground))
        window->DrawList->AddRect(window->Pos, window->Pos + window->Size, GetColorU32(ImGuiCol_Border), rounding, 0, border_size);

    int border_held = window->ResizeBorderHeld;
    if (border_held != -1)
    {
        const ImGuiResizeBorderDef& def = resize_border_def[border_held];
        ImRect border_r = GetResizeBorderRect(window, border_held, rounding, 0.0f);
        window->DrawList->PathArcTo(ImLerp(border_r.Min, border_r.Max, def.SegmentN1) + ImVec2(0.5f, 0.5f) + def.InnerDir * rounding, rounding, def.OuterAngle - IM_PI * 0.25f, def.OuterAngle);
        window->DrawList->PathArcTo(ImLerp(border_r.Min, border_r.Max, def.SegmentN2) + ImVec2(0.5f, 0.5f) + def.InnerDir * rounding, rounding, def.OuterAngle, def.OuterAngle + IM_PI * 0.25f);
        window->DrawList->PathStroke(GetColorU32(ImGuiCol_SeparatorActive), 0, ImMax(2.0f, border_size)); // Thicker than usual
    }
    if (g.Style.FrameBorderSize > 0 && !(window->Flags & ImGuiWindowFlags_NoTitleBar) && !window->DockIsActive)
    {
        float y = window->Pos.y + window->TitleBarHeight() - 1;
        window->DrawList->AddLine(ImVec2(window->Pos.x + border_size, y), ImVec2(window->Pos.x + window->Size.x - border_size, y), GetColorU32(ImGuiCol_Border), g.Style.FrameBorderSize);
    }
}